

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O3

void __thiscall prometheus::Histogram::Observe(Histogram *this,double value)

{
  mutex *__mutex;
  pointer pdVar1;
  ulong uVar2;
  int iVar3;
  undefined8 uVar4;
  ulong uVar5;
  pointer pdVar6;
  
  pdVar1 = (this->bucket_boundaries_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = pdVar1;
  uVar5 = (long)(this->bucket_boundaries_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3;
  while (uVar2 = uVar5, 0 < (long)uVar2) {
    uVar5 = uVar2 >> 1;
    if (pdVar6[uVar5] <= value && value != pdVar6[uVar5]) {
      pdVar6 = pdVar6 + uVar5 + 1;
      uVar5 = ~uVar5 + uVar2;
    }
  }
  __mutex = &this->mutex_;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
    uVar4 = std::__throw_system_error(iVar3);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar4);
  }
  Gauge::Increment(&this->sum_,value);
  Counter::Increment((Counter *)
                     (((long)pdVar6 - (long)pdVar1) +
                     (long)(this->bucket_counts_).
                           super__Vector_base<prometheus::Counter,_std::allocator<prometheus::Counter>_>
                           ._M_impl.super__Vector_impl_data._M_start));
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void Histogram::Observe(const double value) {
  const auto bucket_index = static_cast<std::size_t>(
      std::distance(bucket_boundaries_.begin(),
                    std::lower_bound(bucket_boundaries_.begin(),
                                     bucket_boundaries_.end(), value)));

  std::lock_guard<std::mutex> lock(mutex_);
  sum_.Increment(value);
  bucket_counts_[bucket_index].Increment();
}